

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

void __thiscall nite::Color::set(Color *this,string *hex)

{
  uint uVar1;
  char *__nptr;
  long lVar2;
  string local_48 [40];
  int hexValue;
  char *p;
  string *hex_local;
  Color *this_local;
  
  p = (char *)hex;
  hex_local = (string *)this;
  std::__cxx11::string::substr((ulong)local_48,(ulong)hex);
  __nptr = (char *)std::__cxx11::string::c_str();
  lVar2 = strtol(__nptr,(char **)&stack0xffffffffffffffe0,0x10);
  uVar1 = (uint)lVar2;
  std::__cxx11::string::~string(local_48);
  this->r = (float)((int)uVar1 >> 0x10 & 0xff) / 255.0;
  this->g = (float)((int)uVar1 >> 8 & 0xff) / 255.0;
  this->b = (float)(uVar1 & 0xff) / 255.0;
  this->a = 1.0;
  return;
}

Assistant:

void nite::Color::set(const String &hex){
	char *p;
	int hexValue = strtol(hex.substr(1).c_str(), &p, 16);
  r = ((hexValue >> 16) & 0xFF) / 255.0;  // Extract the RR byte
  g = ((hexValue >> 8) & 0xFF) / 255.0;   // Extract the GG byte
  b = ((hexValue) & 0xFF) / 255.0;        // Extract the BB byte
  a = 1.0f;
}